

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaK_exp2RK(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int iVar2;
  uint uVar3;
  Value *v;
  TValue k;
  Value local_30;
  undefined4 local_28;
  Value local_20;
  undefined4 local_18;
  
  luaK_exp2val(fs,e);
  eVar1 = e->k;
  if (2 < eVar1 - VNIL) {
    if (eVar1 == VK) {
      uVar3 = (e->u).s.info;
      if (0xff < (int)uVar3) goto LAB_0010de3a;
      goto LAB_0010de8d;
    }
    if (eVar1 != VKNUM) goto LAB_0010de3a;
  }
  if (0xff < fs->nk) {
LAB_0010de3a:
    iVar2 = luaK_exp2anyreg(fs,e);
    return iVar2;
  }
  if (eVar1 == VKNUM) {
    local_30 = *(Value *)&e->u;
    local_28 = 3;
LAB_0010de79:
    v = &local_30;
  }
  else {
    if (eVar1 != VNIL) {
      local_30.b._1_3_ = 0;
      local_30.b._0_1_ = eVar1 == VTRUE;
      local_28 = 1;
      goto LAB_0010de79;
    }
    v = &local_20;
    local_18 = 0;
    local_30 = (Value)fs->h;
    local_28 = 5;
  }
  uVar3 = addk(fs,(TValue *)&local_30,(TValue *)v);
  (e->u).s.info = uVar3;
  e->k = VK;
LAB_0010de8d:
  return uVar3 | 0x100;
}

Assistant:

static int luaK_exp2RK(FuncState*fs,expdesc*e){
luaK_exp2val(fs,e);
switch(e->k){
case VKNUM:
case VTRUE:
case VFALSE:
case VNIL:{
if(fs->nk<=((1<<(9-1))-1)){
e->u.s.info=(e->k==VNIL)?nilK(fs):
(e->k==VKNUM)?luaK_numberK(fs,e->u.nval):
boolK(fs,(e->k==VTRUE));
e->k=VK;
return RKASK(e->u.s.info);
}
else break;
}
case VK:{
if(e->u.s.info<=((1<<(9-1))-1))
return RKASK(e->u.s.info);
else break;
}
default:break;
}
return luaK_exp2anyreg(fs,e);
}